

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

Material * __thiscall btSoftBody::appendMaterial(btSoftBody *this)

{
  int iVar1;
  int iVar2;
  Material *pMVar3;
  Material **ptr;
  btScalar bVar4;
  btScalar bVar5;
  Material *pMVar6;
  Material **ppMVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  pMVar6 = (Material *)btAlignedAllocInternal(0x18,0x10);
  (pMVar6->super_Element).m_tag = (void *)0x0;
  pMVar6->m_kLST = 0.0;
  pMVar6->m_kAST = 0.0;
  pMVar6->m_kVST = 0.0;
  pMVar6->m_flags = 0;
  if ((this->m_materials).m_size < 1) {
    (pMVar6->super_Element).m_tag = (void *)0x0;
    pMVar6->m_kLST = 0.0;
    pMVar6->m_kAST = 0.0;
    pMVar6->m_kVST = 0.0;
    pMVar6->m_flags = 0;
  }
  else {
    pMVar3 = *(this->m_materials).m_data;
    iVar1 = pMVar3->m_flags;
    pMVar6->m_kVST = pMVar3->m_kVST;
    pMVar6->m_flags = iVar1;
    bVar4 = pMVar3->m_kLST;
    bVar5 = pMVar3->m_kAST;
    (pMVar6->super_Element).m_tag = (pMVar3->super_Element).m_tag;
    pMVar6->m_kLST = bVar4;
    pMVar6->m_kAST = bVar5;
  }
  iVar1 = (this->m_materials).m_size;
  iVar2 = (this->m_materials).m_capacity;
  if (iVar1 == iVar2) {
    iVar10 = 1;
    if (iVar1 != 0) {
      iVar10 = iVar1 * 2;
    }
    if (iVar2 < iVar10) {
      if (iVar10 == 0) {
        ppMVar7 = (Material **)0x0;
      }
      else {
        ppMVar7 = (Material **)btAlignedAllocInternal((long)iVar10 << 3,0x10);
      }
      lVar8 = (long)(this->m_materials).m_size;
      if (0 < lVar8) {
        lVar9 = 0;
        do {
          ppMVar7[lVar9] = (this->m_materials).m_data[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar8 != lVar9);
      }
      ptr = (this->m_materials).m_data;
      if (ptr != (Material **)0x0) {
        if ((this->m_materials).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_materials).m_data = (Material **)0x0;
      }
      (this->m_materials).m_ownsMemory = true;
      (this->m_materials).m_data = ppMVar7;
      (this->m_materials).m_capacity = iVar10;
    }
  }
  iVar1 = (this->m_materials).m_size;
  (this->m_materials).m_data[iVar1] = pMVar6;
  (this->m_materials).m_size = iVar1 + 1;
  return pMVar6;
}

Assistant:

btSoftBody::Material*		btSoftBody::appendMaterial()
{
	Material*	pm=new(btAlignedAlloc(sizeof(Material),16)) Material();
	if(m_materials.size()>0)
		*pm=*m_materials[0];
	else
		ZeroInitialize(*pm);
	m_materials.push_back(pm);
	return(pm);
}